

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Explosion.cpp
# Opt level: O3

void __thiscall Explosion::Explosion(Explosion *this,float x,float y,bool big)

{
  undefined3 in_register_00000031;
  float fVar1;
  
  Entity::Entity(&this->super_Entity);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_logic_00113680;
  (this->super_Entity).x = x;
  (this->super_Entity).y = y;
  (this->super_Entity).dx = 0.0;
  (this->super_Entity).dy = 0.0;
  if (CONCAT31(in_register_00000031,big) == 0) {
    fVar1 = 12.0;
  }
  else {
    fVar1 = 32.0;
  }
  (this->super_Entity).radius = fVar1;
  (this->super_Entity).isDestructable = false;
  (this->super_Entity).hp = 1;
  *(undefined8 *)&(this->super_Entity).field_0x34 = 100;
  this->big = big;
  return;
}

Assistant:

Explosion::Explosion(float x, float y, bool big)
{
   this->x = x;
   this->y = y;
   dx = 0.0f;
   dy = 0.0f;
   radius = (big) ? 32 : 12;
   isDestructable = false;
   hp = 1;

   frameCount = FRAME_TIME;
   currFrame = 0;
   this->big = big;
}